

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::initValueFromNonbasic(HModel *this,int firstvar,int lastvar)

{
  double dVar1;
  double dVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  int var;
  long lVar8;
  
  piVar3 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)firstvar;
  do {
    if (lastvar < lVar8) {
      return;
    }
    if (piVar3[lVar8] == 0) {
LAB_0012f2d1:
      piVar4[lVar8] = 0;
    }
    else {
      dVar1 = pdVar5[lVar8];
      dVar2 = pdVar6[lVar8];
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        pdVar7[lVar8] = dVar1;
        goto LAB_0012f2d1;
      }
      if (dVar1 <= -1e+200) {
        if (1e+200 <= dVar2) {
          pdVar7[lVar8] = 0.0;
          goto LAB_0012f2d1;
        }
        pdVar7[lVar8] = dVar2;
        piVar4[lVar8] = -1;
      }
      else if (1e+200 <= dVar2) {
        pdVar7[lVar8] = dVar1;
        piVar4[lVar8] = 1;
      }
      else if (piVar4[lVar8] == -1) {
        pdVar7[lVar8] = dVar2;
      }
      else {
        if (piVar4[lVar8] != 1) {
          piVar4[lVar8] = 1;
        }
        pdVar7[lVar8] = dVar1;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void HModel::initValueFromNonbasic(int firstvar, int lastvar) {
  // Initialise workValue and nonbasicMove from nonbasicFlag and
  // bounds, except for boxed variables when nonbasicMove is used to
  // set workValue=workLower/workUpper
  assert(firstvar >= 0);
  assert(lastvar < numTot);
  // double dl_pr_act, norm_dl_pr_act;
  //norm_dl_pr_act = 0.0;
  for (int var = firstvar; var <= lastvar; var++) {
    if (nonbasicFlag[var]) {
      // Nonbasic variable
      //double prev_pr_act = workValue[var];
      if (workLower[var] == workUpper[var]) {
	// Fixed
	workValue[var] = workLower[var];
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
      } else if (!hsol_isInfinity(-workLower[var])) {
	// Finite lower bound so boxed or lower
	if (!hsol_isInfinity(workUpper[var])) {
	  // Finite upper bound so boxed
	  if (nonbasicMove[var] == NONBASIC_MOVE_UP) {
	    // Set at lower
	    workValue[var] = workLower[var];
	  } else if (nonbasicMove[var] == NONBASIC_MOVE_DN) {
	    // Set at upper
	    workValue[var] = workUpper[var];
	  } else {
	    // Invalid nonbasicMove: correct and set value at lower
	    nonbasicMove[var] = NONBASIC_MOVE_UP;
	    workValue[var] = workLower[var];
	  }	  
	} else {
	  // Lower
	  workValue[var] = workLower[var];
	  nonbasicMove[var] = NONBASIC_MOVE_UP;
	}
      } else if (!hsol_isInfinity(workUpper[var])) {
	// Upper
	workValue[var] = workUpper[var];
	nonbasicMove[var] = NONBASIC_MOVE_DN;
      } else {
	// FREE
	workValue[var] = 0;
	nonbasicMove[var] = NONBASIC_MOVE_ZE;
      }
      //dl_pr_act = workValue[var] - prev_pr_act;
      //norm_dl_pr_act += dl_pr_act*dl_pr_act;
      //      if (abs(dl_pr_act) > 1e-4) printf("Var %5d: [LB; Pr; UB] of [%8g; %8g; %8g] Du = %8g; DlPr = %8g\n",
      //					var, workLower[var], workValue[var], workUpper[var], workDual[var], dl_pr_act);
    } else {
      // Basic variable
      nonbasicMove[var] = NONBASIC_MOVE_ZE;
    }
  }
  //  norm_dl_pr_act = sqrt(norm_dl_pr_act);
  //  printf("initValueFromNonbasic: ||Change in nonbasic variables||_2 is %g\n", norm_dl_pr_act);
}